

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

Sym __thiscall covenant::CFG::replaceTerminal(CFG *this,Sym t)

{
  Sym LHS;
  Sym local_5c;
  TermFactory local_58;
  undefined1 local_48 [16];
  pointer local_38;
  iterator local_30;
  Sym *local_28;
  
  if ((t.x & 1U) == 0) {
    LHS = newVar(this);
    local_58.px = (this->_tfac).px;
    local_58.pn.pi_ = (this->_tfac).pn.pi_;
    if (local_58.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_58.pn.pi_)->use_count_ = (local_58.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    Rule::E((Rule *)local_48,&local_58);
    local_5c.x = t.x;
    if (local_30._M_current == local_28) {
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_38,local_30,&local_5c
                );
    }
    else {
      (local_30._M_current)->x = t.x;
      local_30._M_current = local_30._M_current + 1;
    }
    prod(this,LHS,(Rule *)local_48);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_48 + 8));
    boost::detail::shared_count::~shared_count(&local_58.pn);
    t = LHS;
  }
  return (Sym)t.x;
}

Assistant:

Sym replaceTerminal (Sym t)
    {
      if (t.isVar ()) return t;

      Sym nt = newVar();
      prod (nt, Rule::E(_tfac) << t);
      return nt;
    }